

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int unicodeCreate(int nArg,char **azArg,sqlite3_tokenizer **pp)

{
  char *__s;
  int iVar1;
  int iVar2;
  unicode_tokenizer *p;
  size_t sVar3;
  int iVar4;
  long lVar5;
  
  p = (unicode_tokenizer *)sqlite3_malloc(0x18);
  if (p == (unicode_tokenizer *)0x0) {
    iVar1 = 7;
  }
  else {
    (p->base).pModule = (sqlite3_tokenizer_module *)0x0;
    p->eRemoveDiacritic = 0;
    p->nException = 0;
    p->aiException = (int *)0x0;
    p->eRemoveDiacritic = 1;
    iVar1 = 0;
    for (lVar5 = 0; (iVar1 == 0 && (lVar5 < nArg)); lVar5 = lVar5 + 1) {
      __s = azArg[lVar5];
      sVar3 = strlen(__s);
      iVar4 = (int)sVar3;
      if (iVar4 == 0x13) {
        iVar1 = bcmp("remove_diacritics=1",__s,0x13);
        if (iVar1 == 0) {
          p->eRemoveDiacritic = 1;
        }
        else {
          iVar1 = bcmp("remove_diacritics=0",__s,0x13);
          if (iVar1 == 0) {
            p->eRemoveDiacritic = 0;
          }
          else {
            iVar1 = bcmp("remove_diacritics=2",__s,0x13);
            if (iVar1 != 0) goto LAB_0019d326;
            p->eRemoveDiacritic = 2;
          }
        }
        iVar1 = 0;
      }
      else {
        iVar1 = 1;
        if (10 < iVar4) {
LAB_0019d326:
          iVar1 = bcmp("tokenchars=",__s,0xb);
          if (iVar1 == 0) {
            iVar1 = 1;
          }
          else {
            iVar2 = bcmp("separators=",__s,0xb);
            iVar1 = 1;
            if (iVar2 != 0) goto LAB_0019d39e;
            iVar1 = 0;
          }
          iVar1 = unicodeAddExceptions(p,iVar1,__s + 0xb,iVar4 + -0xb);
        }
      }
LAB_0019d39e:
    }
    if (iVar1 != 0) {
      unicodeDestroy((sqlite3_tokenizer *)p);
      p = (unicode_tokenizer *)0x0;
    }
    *pp = &p->base;
  }
  return iVar1;
}

Assistant:

static int unicodeCreate(
  int nArg,                       /* Size of array argv[] */
  const char * const *azArg,      /* Tokenizer creation arguments */
  sqlite3_tokenizer **pp          /* OUT: New tokenizer handle */
){
  unicode_tokenizer *pNew;        /* New tokenizer object */
  int i;
  int rc = SQLITE_OK;

  pNew = (unicode_tokenizer *) sqlite3_malloc(sizeof(unicode_tokenizer));
  if( pNew==NULL ) return SQLITE_NOMEM;
  memset(pNew, 0, sizeof(unicode_tokenizer));
  pNew->eRemoveDiacritic = 1;

  for(i=0; rc==SQLITE_OK && i<nArg; i++){
    const char *z = azArg[i];
    int n = (int)strlen(z);

    if( n==19 && memcmp("remove_diacritics=1", z, 19)==0 ){
      pNew->eRemoveDiacritic = 1;
    }
    else if( n==19 && memcmp("remove_diacritics=0", z, 19)==0 ){
      pNew->eRemoveDiacritic = 0;
    }
    else if( n==19 && memcmp("remove_diacritics=2", z, 19)==0 ){
      pNew->eRemoveDiacritic = 2;
    }
    else if( n>=11 && memcmp("tokenchars=", z, 11)==0 ){
      rc = unicodeAddExceptions(pNew, 1, &z[11], n-11);
    }
    else if( n>=11 && memcmp("separators=", z, 11)==0 ){
      rc = unicodeAddExceptions(pNew, 0, &z[11], n-11);
    }
    else{
      /* Unrecognized argument */
      rc  = SQLITE_ERROR;
    }
  }

  if( rc!=SQLITE_OK ){
    unicodeDestroy((sqlite3_tokenizer *)pNew);
    pNew = 0;
  }
  *pp = (sqlite3_tokenizer *)pNew;
  return rc;
}